

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3RecordErrorOffsetOfExpr(sqlite3 *db,Expr *pExpr)

{
  while( true ) {
    if (pExpr == (Expr *)0x0) {
      return;
    }
    if (((pExpr->flags & 3) == 0) && (0 < (pExpr->w).iJoin)) break;
    pExpr = pExpr->pLeft;
  }
  if ((pExpr->flags >> 0x1e & 1) != 0) {
    return;
  }
  db->errByteOffset = (pExpr->w).iJoin;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RecordErrorOffsetOfExpr(sqlite3 *db, const Expr *pExpr){
  while( pExpr
     && (ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) || pExpr->w.iOfst<=0)
  ){
    pExpr = pExpr->pLeft;
  }
  if( pExpr==0 ) return;
  if( ExprHasProperty(pExpr, EP_FromDDL) ) return;
  db->errByteOffset = pExpr->w.iOfst;
}